

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line.h
# Opt level: O0

void __thiscall kiste::line_data_t::line_data_t(line_data_t *this,class_t *data)

{
  class_t *data_local;
  line_data_t *this_local;
  
  this->_type = class_begin;
  std::vector<kiste::segment_t,_std::allocator<kiste::segment_t>_>::vector(&this->_segments);
  class_t::class_t(&this->_class_data,data);
  member_t::member_t(&this->_member);
  return;
}

Assistant:

line_data_t(const class_t& data) : _type(line_type::class_begin), _class_data(data)
    {
    }